

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

void __thiscall ot::commissioner::TokenManager::~TokenManager(TokenManager *this)

{
  mbedtls_entropy_free((mbedtls_entropy_context *)&this->mEntropy);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&this->mCtrDrbg);
  mbedtls_pk_free((mbedtls_pk_context_conflict *)&this->mPrivateKey);
  mbedtls_pk_free((mbedtls_pk_context_conflict *)&this->mPublicKey);
  mbedtls_pk_free((mbedtls_pk_context_conflict *)&this->mDomainCAPublicKey);
  coap::CoapSecure::~CoapSecure(&this->mRegistrarClient);
  std::__cxx11::string::~string((string *)&this->mDomainName);
  std::__cxx11::string::~string((string *)&this->mCommissionerId);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->mSignedToken).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            );
  return;
}

Assistant:

TokenManager::~TokenManager()
{
    mbedtls_entropy_free(&mEntropy);
    mbedtls_ctr_drbg_free(&mCtrDrbg);
    mbedtls_pk_free(&mPrivateKey);
    mbedtls_pk_free(&mPublicKey);
    mbedtls_pk_free(&mDomainCAPublicKey);
}